

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall World::AnnounceMsg(World *this,Command_Source *from,string *message,bool echo)

{
  pointer ppCVar1;
  Character *this_00;
  int iVar2;
  int iVar3;
  mapped_type *this_01;
  undefined7 in_register_00000009;
  pointer ppCVar4;
  allocator<char> local_176;
  allocator<char> local_175;
  undefined4 local_174;
  Character *local_170;
  string *local_168;
  string from_str;
  PacketBuilder builder;
  key_type local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_174 = (undefined4)CONCAT71(in_register_00000009,echo);
  if (from == (Command_Source *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&from_str,"server",(allocator<char> *)&builder);
  }
  else {
    (*from->_vptr_Command_Source[2])(&from_str,from);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"ChatMaxWidth",&local_175)
  ;
  this_01 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->config,&local_110);
  iVar2 = util::variant::GetInt(this_01);
  util::ucfirst(&local_d0,&from_str);
  std::operator+(&local_b0,&local_d0,"  ");
  iVar3 = util::text_width(&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"...",&local_176);
  util::text_cap((string *)&builder,message,iVar2 - iVar3,&local_f0);
  std::__cxx11::string::operator=((string *)message,(string *)&builder);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  PacketBuilder::PacketBuilder
            (&builder,PACKET_TALK,PACKET_ANNOUNCE,
             message->_M_string_length + from_str._M_string_length + 2);
  local_170 = (Character *)from;
  PacketBuilder::AddBreakString(&builder,&from_str,0xff);
  PacketBuilder::AddBreakString(&builder,message,0xff);
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_168 = message;
  for (ppCVar4 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1
      ) {
    this_00 = *ppCVar4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"@",(allocator<char> *)&local_110);
    std::__cxx11::string::string((string *)&local_70,(string *)&from_str);
    std::__cxx11::string::string((string *)&local_90,(string *)local_168);
    Character::AddChatLog(this_00,&local_50,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (this_00 != local_170 || (char)local_174 != '\0') {
      Character::Send(this_00,&builder);
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  std::__cxx11::string::~string((string *)&from_str);
  return;
}

Assistant:

void World::AnnounceMsg(Command_Source *from, std::string message, bool echo)
{
	std::string from_str = from ? from->SourceName() : "server";

	message = util::text_cap(message, static_cast<int>(this->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from_str) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_ANNOUNCE, 2 + from_str.length() + message.length());
	builder.AddBreakString(from_str);
	builder.AddBreakString(message);

	UTIL_FOREACH(this->characters, character)
	{
		character->AddChatLog("@", from_str, message);

		if (!echo && character == from)
		{
			continue;
		}

		character->Send(builder);
	}
}